

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_object.cpp
# Opt level: O0

global_object_create_result *
mjs::make_function_object
          (global_object_create_result *__return_storage_ptr__,
          gc_heap_ptr<mjs::global_object> *global)

{
  undefined8 uVar1;
  bool bVar2;
  version vVar3;
  global_object *pgVar4;
  function_object *this;
  undefined1 local_b8 [8];
  gc_heap_ptr<mjs::function_object> obj;
  anon_class_16_1_570cf4e1_for_f local_98;
  anon_class_16_1_570cf4e1_for_f local_88;
  anon_class_32_2_842af841_for_f local_78;
  gc_heap_ptr<mjs::gc_string> local_58;
  gc_heap_ptr<mjs::gc_string> local_48;
  anon_class_1_0_00000001_for_f local_35 [13];
  undefined1 local_28 [8];
  object_ptr prototype;
  gc_heap_ptr<mjs::global_object> *global_local;
  
  prototype.super_gc_heap_ptr_untyped._8_8_ = global;
  pgVar4 = gc_heap_ptr<mjs::global_object>::operator->(global);
  (*(pgVar4->super_object)._vptr_object[0xc])();
  bVar2 = gc_heap_ptr_untyped::has_type<mjs::function_object>((gc_heap_ptr_untyped *)local_28);
  if (!bVar2) {
    __assert_fail("prototype.has_type<function_object>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/function_object.cpp"
                  ,0xc4,
                  "global_object_create_result mjs::make_function_object(const gc_heap_ptr<global_object> &)"
                 );
  }
  this = (function_object *)
         gc_heap_ptr<mjs::object>::operator*((gc_heap_ptr<mjs::object> *)local_28);
  gc_heap_ptr<mjs::gc_string>::gc_heap_ptr(&local_48,(nullptr_t)0x0);
  gc_heap_ptr<mjs::gc_string>::gc_heap_ptr(&local_58,(nullptr_t)0x0);
  function_object::
  put_function<mjs::make_function_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__0>
            (this,local_35,&local_48,&local_58,0);
  gc_heap_ptr<mjs::gc_string>::~gc_heap_ptr(&local_58);
  gc_heap_ptr<mjs::gc_string>::~gc_heap_ptr(&local_48);
  uVar1 = prototype.super_gc_heap_ptr_untyped._8_8_;
  gc_heap_ptr<mjs::global_object>::gc_heap_ptr
            (&local_78.global,
             (gc_heap_ptr<mjs::global_object> *)prototype.super_gc_heap_ptr_untyped._8_8_);
  gc_heap_ptr<mjs::object>::gc_heap_ptr(&local_78.prototype,(gc_heap_ptr<mjs::object> *)local_28);
  put_native_function<mjs::make_function_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__1>
            ((gc_heap_ptr<mjs::global_object> *)uVar1,(object_ptr *)local_28,"toString",&local_78,0)
  ;
  make_function_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_1::~__1((__1 *)&local_78);
  pgVar4 = gc_heap_ptr<mjs::global_object>::operator->
                     ((gc_heap_ptr<mjs::global_object> *)prototype.super_gc_heap_ptr_untyped._8_8_);
  vVar3 = global_object::language_version(pgVar4);
  uVar1 = prototype.super_gc_heap_ptr_untyped._8_8_;
  if (0 < (int)vVar3) {
    gc_heap_ptr<mjs::global_object>::gc_heap_ptr
              (&local_88.global,
               (gc_heap_ptr<mjs::global_object> *)prototype.super_gc_heap_ptr_untyped._8_8_);
    put_native_function<mjs::make_function_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__2>
              ((gc_heap_ptr<mjs::global_object> *)uVar1,(object_ptr *)local_28,"call",&local_88,1);
    make_function_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_2::~__2((__2 *)&local_88);
    uVar1 = prototype.super_gc_heap_ptr_untyped._8_8_;
    gc_heap_ptr<mjs::global_object>::gc_heap_ptr
              (&local_98.global,
               (gc_heap_ptr<mjs::global_object> *)prototype.super_gc_heap_ptr_untyped._8_8_);
    put_native_function<mjs::make_function_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__3>
              ((gc_heap_ptr<mjs::global_object> *)uVar1,(object_ptr *)local_28,"apply",&local_98,2);
    make_function_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_3::~__3((__3 *)&local_98);
  }
  pgVar4 = gc_heap_ptr<mjs::global_object>::operator->
                     ((gc_heap_ptr<mjs::global_object> *)prototype.super_gc_heap_ptr_untyped._8_8_);
  vVar3 = global_object::language_version(pgVar4);
  uVar1 = prototype.super_gc_heap_ptr_untyped._8_8_;
  if (1 < (int)vVar3) {
    gc_heap_ptr<mjs::global_object>::gc_heap_ptr
              ((gc_heap_ptr<mjs::global_object> *)&obj.super_gc_heap_ptr_untyped.pos_,
               (gc_heap_ptr<mjs::global_object> *)prototype.super_gc_heap_ptr_untyped._8_8_);
    put_native_function<mjs::make_function_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__4>
              ((gc_heap_ptr<mjs::global_object> *)uVar1,(object_ptr *)local_28,"bind",
               (anon_class_16_1_570cf4e1_for_f *)&obj.super_gc_heap_ptr_untyped.pos_,1);
    make_function_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_4::~__4
              ((__4 *)&obj.super_gc_heap_ptr_untyped.pos_);
  }
  make_raw_function((mjs *)local_b8,
                    (gc_heap_ptr<mjs::global_object> *)prototype.super_gc_heap_ptr_untyped._8_8_);
  gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::function_object,void>
            (&__return_storage_ptr__->obj,(gc_heap_ptr<mjs::function_object> *)local_b8);
  gc_heap_ptr<mjs::object>::gc_heap_ptr
            (&__return_storage_ptr__->prototype,(gc_heap_ptr<mjs::object> *)local_28);
  gc_heap_ptr<mjs::function_object>::~gc_heap_ptr((gc_heap_ptr<mjs::function_object> *)local_b8);
  gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)local_28);
  return __return_storage_ptr__;
}

Assistant:

global_object_create_result make_function_object(const gc_heap_ptr<global_object>& global) {
    auto prototype = global->function_prototype();

    // �15.3.4
    assert(prototype.has_type<function_object>());
    static_cast<function_object&>(*prototype).put_function([](const value&, const std::vector<value>&) {
        return value::undefined;
    }, nullptr, nullptr, 0);

    put_native_function(global, prototype, "toString", [global, prototype](const value& this_, const std::vector<value>&) {
        return value{get_function_object(this_).to_string()};
    }, 0);

    if (global->language_version() >= version::es3) {
        put_native_function(global, prototype, "call", [global](const value& this_, const std::vector<value>& args) {
            std::vector<value> new_args;
            if (args.size() > 1) {
                new_args.insert(new_args.end(), args.cbegin() + 1, args.cend());
            }
            return get_function_object(this_).call(!args.empty() ? args.front() : value::undefined, new_args);
        }, 1);

        put_native_function(global, prototype, "apply", [global](const value& this_, const std::vector<value>& args) {
            auto f = get_function_object_ptr(this_);
            std::vector<value> new_args;

            if (args.size() > 1 && args[1].type() != value_type::undefined && args[1].type() != value_type::null) {
                std::wostringstream woss;
                if (args[1].type() == value_type::object) {
                    auto a = args[1].object_value();
                    auto p = a->prototype();
                    if (global->language_version() >= version::es5
                    || (p && p.get() == global->array_prototype().get()) 
                        || global->is_arguments_array(a)) {
                        const uint32_t len = to_uint32(a->get(L"length"));
                        new_args.resize(len);
                        for (uint32_t i = 0; i < len; ++i) {
                            new_args[i] = a->get(index_string(i));
                        }
                        goto do_call;
                    }
                    woss << a->class_name();
                } else {
                    debug_print(woss, args[1], 4);
                }
                woss << " is not an (arguments) array";
                throw native_error_exception(native_error_type::type, global->stack_trace(), woss.str());
            }
do_call:
            return f->call(!args.empty() ? args.front() : value::undefined, new_args);
        }, 2);
    }

    if (global->language_version() >= version::es5) {
        put_native_function(global, prototype, "bind", [global](const value& this_, const std::vector<value>& args) {
            return value{function_object::bind(get_function_object_ptr(this_), args)};
        }, 1);
    }

    auto obj = make_raw_function(global); // Note: function constructor is added by interpreter
    return { obj, prototype };
}